

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O3

void __thiscall re2c::Cpgoto::emit(Cpgoto *this,OutputFile *o,uint32_t ind,bool *readCh)

{
  OutputFile *pOVar1;
  opt_t *poVar2;
  undefined4 in_register_00000014;
  SwitchIf *in_R9;
  string yych;
  string local_40;
  
  output_hgo_abi_cxx11_
            (&local_40,(re2c *)o,(OutputFile *)CONCAT44(in_register_00000014,ind),(uint32_t)readCh,
             (bool *)this->hgo,in_R9);
  OutputFile::ws(o,"{\n");
  CpgotoTable::emit(this->table,o,ind + 1);
  pOVar1 = OutputFile::wind(o,ind + 1);
  pOVar1 = OutputFile::ws(pOVar1,"goto *");
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
  pOVar1 = OutputFile::wstring(pOVar1,&poVar2->yytarget);
  pOVar1 = OutputFile::ws(pOVar1,"[");
  pOVar1 = OutputFile::wstring(pOVar1,&local_40);
  OutputFile::ws(pOVar1,"];\n");
  pOVar1 = OutputFile::wind(o,ind);
  OutputFile::ws(pOVar1,"}\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Cpgoto::emit (OutputFile & o, uint32_t ind, bool & readCh)
{
	std::string yych = output_hgo (o, ind, readCh, hgo);
	o.ws("{\n");
	table->emit (o, ++ind);
	o.wind(ind).ws("goto *").wstring(opts->yytarget).ws("[").wstring(yych).ws("];\n");
	o.wind(--ind).ws("}\n");
}